

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

pattern * distItem(void)

{
  int iVar1;
  pattern *ppVar2;
  bool bVar3;
  char local_98 [8];
  char msg [100];
  float local_24;
  int ok;
  float signFactor;
  float pz;
  float py;
  float px;
  float dst;
  pattern *f;
  
  py = 0.0;
  pz = 0.0;
  signFactor = 0.0;
  ok = 0;
  bVar3 = true;
  ppVar2 = makeTerminal(0x13e,0);
  matchTok(0x194);
  if (lookahead == 0x192) {
    py = realtokval;
    matchTok(0x192);
  }
  else {
    bVar3 = lookahead == 0x191;
    if (bVar3) {
      py = (float)tokenval;
      matchTok(0x191);
    }
  }
  if (((bVar3) && (lookahead == 0x193)) &&
     (iVar1 = strcmp(SymTable[tokenval].lexptr,"OF"), iVar1 == 0)) {
    matchTok(0x193);
  }
  else {
    bVar3 = false;
  }
  local_24 = 1.0;
  if ((bVar3) && (lookahead == 0x2d)) {
    matchTok(0x2d);
    local_24 = -1.0;
  }
  if ((bVar3) && (lookahead == 0x192)) {
    pz = local_24 * realtokval;
    matchTok(0x192);
  }
  else if ((bVar3) && (lookahead == 0x191)) {
    pz = local_24 * (float)tokenval;
    matchTok(0x191);
  }
  else {
    bVar3 = false;
  }
  if ((bVar3) && (lookahead == 0x2c)) {
    matchTok(0x2c);
  }
  else {
    bVar3 = false;
  }
  local_24 = 1.0;
  if ((bVar3) && (lookahead == 0x2d)) {
    matchTok(0x2d);
    local_24 = -1.0;
  }
  if ((bVar3) && (lookahead == 0x192)) {
    signFactor = local_24 * realtokval;
    matchTok(0x192);
  }
  else if ((bVar3) && (lookahead == 0x191)) {
    signFactor = local_24 * (float)tokenval;
    matchTok(0x191);
  }
  else {
    bVar3 = false;
  }
  if ((bVar3) && (lookahead == 0x2c)) {
    matchTok(0x2c);
  }
  else {
    bVar3 = false;
  }
  local_24 = 1.0;
  if ((bVar3) && (lookahead == 0x2d)) {
    matchTok(0x2d);
    local_24 = -1.0;
  }
  if ((bVar3) && (lookahead == 0x192)) {
    ok = (int)(local_24 * realtokval);
    matchTok(0x192);
  }
  else if ((bVar3) && (lookahead == 0x191)) {
    ok = (int)(local_24 * (float)tokenval);
    matchTok(0x191);
  }
  else {
    bVar3 = false;
  }
  if (bVar3) {
    ppVar2->fvec[0] = py;
    ppVar2->fvec[1] = pz;
    ppVar2->fvec[2] = signFactor;
    ppVar2->fvec[3] = (float)ok;
  }
  else {
    describeLookahead(local_98,"syntax: parsing WITHIN: ");
    errmsg(local_98);
    ParseError = 1;
  }
  return ppVar2;
}

Assistant:

pattern* distItem() {
   pattern *f;
   float dst = 0.0, px = 0.0, py = 0.0, pz = 0.0, signFactor = 0.0;
   int ok = 1;

/* within */
   f = makeTerminal(DIST_NODE, 0);
   matchTok(WITHIN_TOK);
/* distance */
   if (ok && lookahead == REALNUM_TOK) {
      dst = realtokval;
      matchTok(REALNUM_TOK);
   }
   else if (ok && lookahead == NUM_TOK) {
      dst = tokenval;
      matchTok(NUM_TOK);
   }
   else { ok = 0; }
/* of */
   if (ok && lookahead == ID_TOK
          && strcmp(SymTable[tokenval].lexptr, "OF") == 0) {
      matchTok(ID_TOK);
   }
   else { ok = 0; }
/* x */
   signFactor = 1.0;
   if (ok && lookahead == '-') {
      matchTok('-');
      signFactor = -1.0;
   }

   if (ok && lookahead == REALNUM_TOK) {
      px = signFactor * realtokval;
      matchTok(REALNUM_TOK);
   }
   else if (ok && lookahead == NUM_TOK) {
      px = signFactor * tokenval;
      matchTok(NUM_TOK);
   }
   else { ok = 0; }
/* , */
   if (ok && lookahead == ',') {
      matchTok(',');
   }
   else { ok = 0; }
/* y */
   signFactor = 1.0;
   if (ok && lookahead == '-') {
      matchTok('-');
      signFactor = -1.0;
   }

   if (ok && lookahead == REALNUM_TOK) {
      py = signFactor * realtokval;
      matchTok(REALNUM_TOK);
   }
   else if (ok && lookahead == NUM_TOK) {
      py = signFactor * tokenval;
      matchTok(NUM_TOK);
   }
   else { ok = 0; }
/* , */
   if (ok && lookahead == ',') {
      matchTok(',');
   }
   else { ok = 0; }
/* z */
   signFactor = 1.0;
   if (ok && lookahead == '-') {
      matchTok('-');
      signFactor = -1.0;
   }

   if (ok && lookahead == REALNUM_TOK) {
      pz = signFactor * realtokval;
      matchTok(REALNUM_TOK);
   }
   else if (ok && lookahead == NUM_TOK) {
      pz = signFactor * tokenval;
      matchTok(NUM_TOK);
   }
   else { ok = 0; }

/* info is packed into the floating-point vector */
   if (ok) {
      f->fvec[0] = dst;
      f->fvec[1] = px;
      f->fvec[2] = py;
      f->fvec[3] = pz;
   }
   else {
      char msg[100];
      describeLookahead(msg,"syntax: parsing WITHIN: ");
      errmsg(msg);
      ParseError = TRUE;
   }
   return f;
}